

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O3

ggml_tensor * __thiscall
test_conv_transpose_1d::build_graph(test_conv_transpose_1d *this,ggml_context *ctx)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ggml_tensor *pgVar3;
  
  uVar1 = ggml_new_tensor(ctx,0,4,&this->ne_input);
  test_case::add_sentinel(&this->super_test_case,ctx);
  ggml_set_name(uVar1,"input");
  uVar2 = ggml_new_tensor(ctx,0,4,&this->ne_kernel);
  test_case::add_sentinel(&this->super_test_case,ctx);
  ggml_set_name(uVar2,"kernel");
  pgVar3 = (ggml_tensor *)ggml_conv_transpose_1d(ctx,uVar2,uVar1,this->s0,this->p0,this->d0);
  ggml_set_name(pgVar3,"out");
  return pgVar3;
}

Assistant:

ggml_tensor * build_graph(ggml_context * ctx) override {
        ggml_tensor * input = ggml_new_tensor(ctx, GGML_TYPE_F32, 4, ne_input.data());
        ggml_set_name(input, "input");

        ggml_tensor * kernel = ggml_new_tensor(ctx, GGML_TYPE_F32, 4, ne_kernel.data());
        ggml_set_name(kernel, "kernel");

        ggml_tensor * out = ggml_conv_transpose_1d(ctx, kernel, input, s0, p0, d0);
        ggml_set_name(out, "out");

        return out;
    }